

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O2

void __thiscall MT32Emu::TVP::nextPhase(TVP *this)

{
  PartialParam *partialParam;
  int iVar1;
  uint uVar2;
  Bit32s targetPitchOffset;
  Poly *this_00;
  int iVar3;
  
  iVar1 = this->phase + 1;
  this->phase = iVar1;
  iVar3 = 4;
  if (iVar1 != 6) {
    iVar3 = iVar1;
  }
  partialParam = this->partialParam;
  this_00 = Partial::getPoly(this->partial);
  uVar2 = Poly::getVelocity(this_00);
  targetPitchOffset = calcTargetPitchOffsetWithoutLFO(partialParam,iVar3,uVar2);
  this->targetPitchOffsetWithoutLFO = targetPitchOffset;
  uVar2 = (uint)(this->partialParam->pitchEnv).time[(long)iVar3 + -1];
  iVar3 = uVar2 - (int)this->timeKeyfollowSubtraction;
  if (iVar3 != 0 && (int)this->timeKeyfollowSubtraction <= (int)uVar2) {
    setupPitchChange(this,targetPitchOffset,(Bit8u)iVar3);
    updatePitch(this);
    return;
  }
  targetPitchOffsetReached(this);
  return;
}

Assistant:

void TVP::nextPhase() {
	phase++;
	int envIndex = phase == 6 ? 4 : phase;

	targetPitchOffsetWithoutLFO = calcTargetPitchOffsetWithoutLFO(partialParam, envIndex, partial->getPoly()->getVelocity()); // pitch we'll reach at the end

	int changeDuration = partialParam->pitchEnv.time[envIndex - 1];
	changeDuration -= timeKeyfollowSubtraction;
	if (changeDuration > 0) {
		setupPitchChange(targetPitchOffsetWithoutLFO, changeDuration); // changeDuration between 0 and 112 now
		updatePitch();
	} else {
		targetPitchOffsetReached();
	}
}